

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCmpNodes(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  _xmlNode *p_Var4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlElementType xVar7;
  int iVar8;
  xmlNodePtr pxVar9;
  int iVar10;
  _xmlNode *p_Var11;
  _xmlNode *p_Var12;
  xmlNodePtr pxVar13;
  
  if (node2 == (xmlNodePtr)0x0 || node1 == (xmlNodePtr)0x0) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  xVar7 = node1->type;
  if (xVar7 != XML_ATTRIBUTE_NODE) {
    pxVar9 = (_xmlNode *)0x0;
  }
  else {
    pxVar9 = node1;
    node1 = node1->parent;
  }
  xVar1 = node2->type;
  if (xVar1 != XML_ATTRIBUTE_NODE) {
    p_Var12 = (xmlNodePtr)0x0;
    p_Var11 = node2;
  }
  else {
    p_Var11 = node2->parent;
    p_Var12 = node2;
  }
  if (node1 == p_Var11) {
    if ((xVar7 == XML_ATTRIBUTE_NODE) != (xVar1 == XML_ATTRIBUTE_NODE)) {
      return (uint)(xVar1 == XML_ATTRIBUTE_NODE) * 2 + -1;
    }
    if (xVar7 == XML_ATTRIBUTE_NODE) {
      do {
        p_Var12 = p_Var12->prev;
        if (p_Var12 == (_xmlNode *)0x0) {
          return -1;
        }
      } while (p_Var12 != pxVar9);
      return 1;
    }
    return 0;
  }
  if (((node1->type != XML_NAMESPACE_DECL) && (p_Var11->type != XML_NAMESPACE_DECL)) &&
     (node1 != p_Var11->prev)) {
    if (node1 == p_Var11->next) {
      return -1;
    }
    if ((((node1->type == XML_ELEMENT_NODE) && (p_Var11->type == XML_ELEMENT_NODE)) &&
        ((pxVar2 = node1->content, (long)pxVar2 < 0 &&
         ((pxVar3 = p_Var11->content, (long)pxVar3 < 0 && (node1->doc == p_Var11->doc)))))) &&
       (xVar7 = (((long)pxVar3 < (long)pxVar2) - 1) + (uint)((long)pxVar3 < (long)pxVar2),
       pxVar3 != pxVar2)) {
      return xVar7;
    }
    iVar8 = 0;
    iVar10 = 0;
    pxVar9 = p_Var11;
    if (p_Var11->parent != (xmlNodePtr)0x0) {
      iVar10 = 0;
      pxVar13 = p_Var11->parent;
      do {
        pxVar9 = pxVar13;
        if (pxVar9 == node1) {
          return 1;
        }
        iVar10 = iVar10 + 1;
        pxVar13 = pxVar9->parent;
      } while (pxVar9->parent != (_xmlNode *)0x0);
    }
    pxVar13 = node1;
    if (node1->parent != (xmlNodePtr)0x0) {
      iVar8 = 0;
      pxVar6 = node1->parent;
      do {
        pxVar13 = pxVar6;
        if (pxVar13 == p_Var11) {
          return -1;
        }
        iVar8 = iVar8 + 1;
        pxVar6 = pxVar13->parent;
      } while (pxVar13->parent != (_xmlNode *)0x0);
    }
    iVar5 = iVar8;
    if (pxVar9 != pxVar13) {
      return -2;
    }
    for (; iVar10 < iVar8; iVar8 = iVar8 + -1) {
      node1 = node1->parent;
      iVar5 = iVar10;
    }
    for (; iVar5 < iVar10; iVar10 = iVar10 + -1) {
      p_Var11 = p_Var11->parent;
    }
    while( true ) {
      p_Var12 = node1->parent;
      p_Var4 = p_Var11->parent;
      if (p_Var12 == p_Var4) break;
      if (p_Var12 == (_xmlNode *)0x0) {
        return -2;
      }
      p_Var11 = p_Var4;
      node1 = p_Var12;
      if (p_Var4 == (_xmlNode *)0x0) {
        return -2;
      }
    }
    if (node1 != p_Var11->prev) {
      if (node1 == p_Var11->next) {
        return -1;
      }
      if ((((node1->type == XML_ELEMENT_NODE) && (p_Var11->type == XML_ELEMENT_NODE)) &&
          (pxVar2 = node1->content, (long)pxVar2 < 0)) &&
         ((pxVar3 = p_Var11->content, (long)pxVar3 < 0 && (node1->doc == p_Var11->doc)))) {
        if ((long)pxVar2 < (long)pxVar3) {
          xVar7 = 0xffffffff;
        }
        if ((long)pxVar3 < (long)pxVar2) {
          xVar7 = XML_ELEMENT_NODE;
        }
        if (pxVar3 != pxVar2) {
          return xVar7;
        }
      }
      do {
        node1 = node1->next;
        if (node1 == (_xmlNode *)0x0) {
          return -1;
        }
      } while (node1 != p_Var11);
    }
  }
  return 1;
}

Assistant:

int
xmlXPathCmpNodes(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int attr1 = 0, attr2 = 0;
    xmlNodePtr attrNode1 = NULL, attrNode2 = NULL;
    xmlNodePtr cur, root;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);
    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    if (node1 == node2)		/* trivial case */
	return(0);
    if (node1->type == XML_ATTRIBUTE_NODE) {
	attr1 = 1;
	attrNode1 = node1;
	node1 = node1->parent;
    }
    if (node2->type == XML_ATTRIBUTE_NODE) {
	attr2 = 1;
	attrNode2 = node2;
	node2 = node2->parent;
    }
    if (node1 == node2) {
	if (attr1 == attr2) {
	    /* not required, but we keep attributes in order */
	    if (attr1 != 0) {
	        cur = attrNode2->prev;
		while (cur != NULL) {
		    if (cur == attrNode1)
		        return (1);
		    cur = cur->prev;
		}
		return (-1);
	    }
	    return(0);
	}
	if (attr2 == 1)
	    return(1);
	return(-1);
    }
    if ((node1->type == XML_NAMESPACE_DECL) ||
        (node2->type == XML_NAMESPACE_DECL))
	return(1);
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {
	ptrdiff_t l1, l2;

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {
	ptrdiff_t l1, l2;

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}